

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O1

unique_ptr<cmNinjaTargetGenerator,_std::default_delete<cmNinjaTargetGenerator>_> __thiscall
cmNinjaTargetGenerator::New(cmNinjaTargetGenerator *this,cmGeneratorTarget *target)

{
  bool bVar1;
  TargetType TVar2;
  cmNinjaNormalTargetGenerator *this_00;
  
  TVar2 = cmGeneratorTarget::GetType(target);
  if (TVar2 < UTILITY) {
    this_00 = (cmNinjaNormalTargetGenerator *)operator_new(0x110);
    cmNinjaNormalTargetGenerator::cmNinjaNormalTargetGenerator(this_00,target);
    goto LAB_00467fd3;
  }
  if (1 < TVar2 - UTILITY) {
    if (TVar2 != INTERFACE_LIBRARY) {
      (this->super_cmCommonTargetGenerator)._vptr_cmCommonTargetGenerator = (_func_int **)0x0;
      this_00 = (cmNinjaNormalTargetGenerator *)0x0;
      goto LAB_00467fd3;
    }
    bVar1 = cmGeneratorTarget::HaveCxx20ModuleSources(target,(string *)0x0);
    if (bVar1) {
      this_00 = (cmNinjaNormalTargetGenerator *)operator_new(0x110);
      cmNinjaNormalTargetGenerator::cmNinjaNormalTargetGenerator(this_00,target);
      goto LAB_00467fd3;
    }
  }
  this_00 = (cmNinjaNormalTargetGenerator *)operator_new(0xf0);
  cmNinjaUtilityTargetGenerator::cmNinjaUtilityTargetGenerator
            ((cmNinjaUtilityTargetGenerator *)this_00,target);
LAB_00467fd3:
  (this->super_cmCommonTargetGenerator)._vptr_cmCommonTargetGenerator = (_func_int **)this_00;
  return (__uniq_ptr_data<cmNinjaTargetGenerator,_std::default_delete<cmNinjaTargetGenerator>,_true,_true>
          )(__uniq_ptr_data<cmNinjaTargetGenerator,_std::default_delete<cmNinjaTargetGenerator>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<cmNinjaTargetGenerator> cmNinjaTargetGenerator::New(
  cmGeneratorTarget* target)
{
  switch (target->GetType()) {
    case cmStateEnums::EXECUTABLE:
    case cmStateEnums::SHARED_LIBRARY:
    case cmStateEnums::STATIC_LIBRARY:
    case cmStateEnums::MODULE_LIBRARY:
    case cmStateEnums::OBJECT_LIBRARY:
      return cm::make_unique<cmNinjaNormalTargetGenerator>(target);

    case cmStateEnums::INTERFACE_LIBRARY:
      if (target->HaveCxx20ModuleSources()) {
        return cm::make_unique<cmNinjaNormalTargetGenerator>(target);
      }
      CM_FALLTHROUGH;

    case cmStateEnums::UTILITY:
    case cmStateEnums::GLOBAL_TARGET:
      return cm::make_unique<cmNinjaUtilityTargetGenerator>(target);

    default:
      return std::unique_ptr<cmNinjaTargetGenerator>();
  }
}